

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O0

void __thiscall MainWindow::onResize(MainWindow *this,int w,int h,StateChange sc)

{
  int iVar1;
  bool bVar2;
  bool m;
  StateChange sc_local;
  int h_local;
  int w_local;
  MainWindow *this_local;
  
  iVar1 = width(this);
  bVar2 = false;
  if (w == iVar1) {
    iVar1 = height(this);
    bVar2 = h == iVar1;
  }
  if ((!bVar2) && (sc != Minimized)) {
    printf("realloc buffers\n");
    free_buffers(this);
    SoftwareRenderer::resize(&this->renderer,w,h);
    (this->window).size.w = w;
    (this->window).size.h = h;
    allocate_buffers(this);
  }
  std::function<void_(int,_int,_StateChange)>::operator()(&this->onAppResize,w,h,sc);
  return;
}

Assistant:

void onResize(int w, int h, StateChange sc)
	{
		//printf("resize\n");
		bool m = (w == width()) && (h == height());
		if(!m && sc != StateChange::Minimized)
		{
			printf("realloc buffers\n");
			free_buffers();
			renderer.resize(w, h);
			window.size.w = w; window.size.h = h;
			allocate_buffers();
			
		}
		onAppResize(w, h, sc);
		if(!m)
		{
			//printf("stepping and redrawing\n");
			//onAppStep();
			//window.redraw();
		}
	}